

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<double>_>::Diagonal
          (TPZMatrix<std::complex<double>_> *this,complex<double> val)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  int64_t iVar5;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  complex<double> local_38;
  long local_28;
  long local_20;
  undefined1 local_10 [16];
  
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar4 != iVar5) {
    Error(in_stack_000001a0,in_stack_00000198);
  }
  local_20 = 0;
  while( true ) {
    lVar1 = local_20;
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar4 <= lVar1) break;
    local_28 = 0;
    while( true ) {
      lVar1 = local_28;
      iVar4 = TPZBaseMatrix::Cols(in_RDI);
      lVar3 = local_20;
      lVar2 = local_28;
      if (iVar4 <= lVar1) break;
      if (local_20 == local_28) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_28,local_10);
      }
      else {
        std::complex<double>::complex(&local_38,0.0,0.0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar3,lVar2,&local_38);
      }
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}